

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgIOHelpers.hpp
# Opt level: O2

vector<int,_std::allocator<int>_> * __thiscall
TasGrid::IO::readVector<TasGrid::IO::mode_ascii_type,int,unsigned_long>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,IO *this,istream *is,
          unsigned_long num_entries)

{
  allocator_type local_11;
  
  ::std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,(size_type)is,&local_11);
  readVector<TasGrid::IO::mode_ascii_type,int>((istream *)this,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::vector<VecType> readVector(std::istream &is, SizeType num_entries){
    std::vector<VecType> x((size_t) num_entries);
    readVector<iomode, VecType>(is, x);
    return x;
}